

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

string * __thiscall
cmsys::SystemTools::EscapeChars_abi_cxx11_
          (string *__return_storage_ptr__,SystemTools *this,char *str,char *chars_to_escape,
          char escape_char)

{
  SystemTools SVar1;
  SystemTools *pSVar2;
  SystemTools SVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (SystemTools *)0x0) {
    if ((str == (char *)0x0) || (*str == '\0')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      strlen((char *)this);
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      SVar1 = *this;
      if (SVar1 != (SystemTools)0x0) {
        do {
          SVar3 = (SystemTools)*str;
          pSVar2 = (SystemTools *)(str + 1);
          while (SVar3 != (SystemTools)0x0) {
            if (SVar1 == SVar3) {
              std::__cxx11::string::push_back((char)__return_storage_ptr__);
              break;
            }
            SVar3 = *pSVar2;
            pSVar2 = pSVar2 + 1;
          }
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          SVar1 = this[1];
          this = this + 1;
        } while (SVar1 != (SystemTools)0x0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::EscapeChars(
  const char *str,
  const char *chars_to_escape,
  char escape_char)
{
  std::string n;
  if (str)
    {
    if (!chars_to_escape || !*chars_to_escape)
      {
      n.append(str);
      }
    else
      {
      n.reserve(strlen(str));
      while (*str)
        {
        const char *ptr = chars_to_escape;
        while (*ptr)
          {
          if (*str == *ptr)
            {
            n += escape_char;
            break;
            }
          ++ptr;
          }
        n += *str;
        ++str;
        }
      }
    }
  return n;
}